

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rungame.c
# Opt level: O2

int compare_filetime(void *arg1,void *arg2)

{
  char *__file;
  stat s2;
  stat s1;
  stat sStack_138;
  stat local_a8;
  
  __file = *arg2;
  stat(*arg1,&local_a8);
  stat(__file,&sStack_138);
  return (int)sStack_138.st_mtim.tv_sec - (int)local_a8.st_mtim.tv_sec;
}

Assistant:

static int compare_filetime(const void *arg1, const void *arg2)
{
    const char *file1 = *(const char**)arg1;
    const char *file2 = *(const char**)arg2;
    
    struct stat s1, s2;
    
    stat(file1, &s1);
    stat(file2, &s2);
    
    return s2.st_mtime - s1.st_mtime;
}